

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O3

void RDL_getNodes_internal
               (RDL_data *data,uint bcc_index,uint urf_internal_index,uint rcf_internal_index,
               char *atoms)

{
  RDL_graph *pRVar1;
  RDL_cfam **ppRVar2;
  char *visited;
  
  pRVar1 = data->bccGraphs->bcc_graphs[bcc_index];
  ppRVar2 = data->urfInfoPerBCC[bcc_index]->URFs[urf_internal_index];
  visited = (char *)calloc(1,(ulong)pRVar1->V);
  RDL_giveVertices(ppRVar2[rcf_internal_index]->r,ppRVar2[rcf_internal_index]->q,atoms,
                   data->spiPerBCC[bcc_index],visited);
  memset(visited,0,(ulong)pRVar1->V);
  RDL_giveVertices(ppRVar2[rcf_internal_index]->r,ppRVar2[rcf_internal_index]->p,atoms,
                   data->spiPerBCC[bcc_index],visited);
  if ((ulong)ppRVar2[rcf_internal_index]->x != 0xffffffff) {
    atoms[ppRVar2[rcf_internal_index]->x] = '\x01';
  }
  free(visited);
  return;
}

Assistant:

static void RDL_getNodes_internal(const RDL_data *data, unsigned bcc_index,
    unsigned urf_internal_index, unsigned rcf_internal_index, char* atoms)
{
  const RDL_cfam **URF;
  char *visited;
  const RDL_graph* graph;

  graph = data->bccGraphs->bcc_graphs[bcc_index];

  URF = (const RDL_cfam **)data->urfInfoPerBCC[bcc_index]->URFs[urf_internal_index];

  visited = malloc(graph->V *  sizeof(*visited));

  /* BFS on both shortest path graphs */
  memset(visited, 0, graph->V *  sizeof(*visited));
  RDL_giveVertices(URF[rcf_internal_index]->r, URF[rcf_internal_index]->q,
      atoms, data->spiPerBCC[bcc_index], visited);

  memset(visited, 0, graph->V *  sizeof(*visited));
  RDL_giveVertices(URF[rcf_internal_index]->r, URF[rcf_internal_index]->p,
      atoms, data->spiPerBCC[bcc_index], visited);

  if(URF[rcf_internal_index]->x < UINT_MAX) /*even cycle*/ {
    atoms[URF[rcf_internal_index]->x] = 1;
  }
  free(visited);
}